

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::updateFederateMode(Federate *this,Modes newMode)

{
  Modes MVar1;
  Modes __args_1;
  function<void_()> *this_00;
  
  MVar1 = (this->currentMode)._M_i;
  LOCK();
  (this->currentMode)._M_i = newMode;
  UNLOCK();
  if ((byte)(newMode - PENDING_INIT) < 5 || MVar1 == newMode) {
    return;
  }
  if ((this->modeUpdateCallback).super__Function_base._M_manager == (_Manager_type)0x0)
  goto switchD_0019239b_default;
  __args_1 = MVar1;
  switch(MVar1) {
  case STARTUP:
  case INITIALIZING:
  case EXECUTING:
  case FINALIZE:
  case ERROR_STATE:
  case FINISHED:
    goto switchD_0019239b_caseD_0;
  case PENDING_INIT:
    __args_1 = STARTUP;
    goto switchD_0019239b_caseD_0;
  case PENDING_EXEC:
    __args_1 = INITIALIZING;
    if (newMode != INITIALIZING) goto switchD_0019239b_caseD_0;
    break;
  case PENDING_TIME:
  case PENDING_ITERATIVE_TIME:
    __args_1 = EXECUTING;
    if (newMode != EXECUTING) goto switchD_0019239b_caseD_0;
    break;
  case PENDING_FINALIZE:
    __args_1 = EXECUTING;
switchD_0019239b_caseD_0:
    std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
              (&this->modeUpdateCallback,newMode,__args_1);
  }
switchD_0019239b_default:
  if ((newMode == EXECUTING) &&
     ((this->executingEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    this_00 = &this->executingEntryCallback;
    if ((MVar1 == INITIALIZING) || (MVar1 == PENDING_EXEC)) {
LAB_001923ec:
      std::function<void_()>::operator()(this_00);
      return;
    }
  }
  else if ((0xfd < (byte)(newMode - PENDING_INIT)) &&
          ((this->cosimulationTerminationCallback).super__Function_base._M_manager !=
           (_Manager_type)0x0)) {
    this_00 = &this->cosimulationTerminationCallback;
    goto LAB_001923ec;
  }
  return;
}

Assistant:

void Federate::updateFederateMode(Modes newMode)
{
    const Modes oldMode = currentMode.load();
    currentMode.store(newMode);
    if (newMode == oldMode) {
        return;
    }
    if (newMode == Modes::PENDING_EXEC || newMode == Modes::PENDING_INIT ||
        newMode == Modes::PENDING_ITERATIVE_TIME || newMode == Modes::PENDING_TIME ||
        newMode == Modes::PENDING_FINALIZE) {
        return;
    }
    if (modeUpdateCallback) {
        switch (oldMode) {
            case Modes::PENDING_ITERATIVE_INIT:
                break;
            case Modes::PENDING_INIT:
                modeUpdateCallback(newMode, Modes::STARTUP);
                break;
            case Modes::PENDING_EXEC:
                if (newMode != Modes::INITIALIZING) {
                    modeUpdateCallback(newMode, Modes::INITIALIZING);
                }
                break;
            case Modes::PENDING_ITERATIVE_TIME:
            case Modes::PENDING_TIME:
                if (newMode != Modes::EXECUTING) {
                    modeUpdateCallback(newMode, Modes::EXECUTING);
                }
                break;
            case Modes::PENDING_FINALIZE:
                modeUpdateCallback(newMode, Modes::EXECUTING);
                break;
            case Modes::FINALIZE:
            case Modes::INITIALIZING:
            case Modes::EXECUTING:
            case Modes::FINISHED:
            case Modes::ERROR_STATE:
            case Modes::STARTUP:
                modeUpdateCallback(newMode, oldMode);
                break;
        }
    }
    if (executingEntryCallback) {
        if (newMode == Modes::EXECUTING &&
            (oldMode == Modes::INITIALIZING || oldMode == Modes::PENDING_EXEC)) {
            executingEntryCallback();
        }
    }
    if (newMode == Modes::FINALIZE || newMode == Modes::ERROR_STATE) {
        if (cosimulationTerminationCallback) {
            cosimulationTerminationCallback();
        }
    }
}